

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void auxsort(lua_State *L,int l,int u)

{
  StkId pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_40;
  
  do {
    if (u <= l) {
      return;
    }
    lua_rawgeti(L,1,l);
    lua_rawgeti(L,1,u);
    iVar3 = sort_comp(L,-1,-2);
    if (iVar3 == 0) {
      L->top = L->top + -2;
    }
    else {
      lua_rawseti(L,1,l);
      lua_rawseti(L,1,u);
    }
    if (u - l == 1) {
LAB_00110770:
      bVar2 = false;
    }
    else {
      local_40 = (u + l) / 2;
      lua_rawgeti(L,1,local_40);
      lua_rawgeti(L,1,l);
      iVar3 = sort_comp(L,-2,-1);
      if (iVar3 == 0) {
        L->top = L->top + -1;
        lua_rawgeti(L,1,u);
        iVar3 = sort_comp(L,-1,-2);
        if (iVar3 != 0) {
          lua_rawseti(L,1,local_40);
          iVar3 = u;
          goto LAB_00110765;
        }
        L->top = L->top + -2;
      }
      else {
        lua_rawseti(L,1,local_40);
        iVar3 = l;
LAB_00110765:
        lua_rawseti(L,1,iVar3);
      }
      if (u - l == 2) goto LAB_00110770;
      lua_rawgeti(L,1,local_40);
      pTVar1 = L->top;
      pTVar1->value = pTVar1[-1].value;
      pTVar1->tt = pTVar1[-1].tt;
      L->top = L->top + 1;
      iVar3 = u + -1;
      lua_rawgeti(L,1,iVar3);
      iVar6 = iVar3;
      iVar5 = l;
      do {
        lua_rawseti(L,1,local_40);
        lua_rawseti(L,1,iVar6);
        local_40 = iVar5 + 1;
        lua_rawgeti(L,1,local_40);
        iVar4 = sort_comp(L,-1,-2);
        iVar7 = iVar5;
        if (iVar4 != 0) {
          do {
            local_40 = iVar5;
            if (u <= local_40) goto LAB_00110977;
            L->top = L->top + -1;
            lua_rawgeti(L,1,local_40 + 2);
            iVar4 = sort_comp(L,-1,-2);
            iVar7 = local_40 + 1;
            iVar5 = iVar7;
          } while (iVar4 != 0);
          local_40 = local_40 + 2;
        }
        iVar5 = iVar6 + -1;
        lua_rawgeti(L,1,iVar5);
        iVar4 = sort_comp(L,-3,-1);
        if (iVar4 != 0) {
          do {
            iVar5 = iVar6;
            if (iVar5 <= l) {
LAB_00110977:
              luaL_error(L,"invalid order function for sorting");
            }
            L->top = L->top + -1;
            lua_rawgeti(L,1,iVar5 + -2);
            iVar4 = sort_comp(L,-3,-1);
            iVar6 = iVar5 + -1;
          } while (iVar4 != 0);
          iVar5 = iVar5 + -2;
        }
        bVar2 = local_40 < iVar6;
        iVar6 = iVar5;
        iVar5 = local_40;
      } while (bVar2);
      L->top = L->top + -3;
      lua_rawgeti(L,1,iVar3);
      lua_rawgeti(L,1,local_40);
      lua_rawseti(L,1,iVar3);
      lua_rawseti(L,1,local_40);
      iVar3 = iVar7 + 2;
      iVar5 = iVar7;
      iVar6 = u;
      if (local_40 - l < u - local_40) {
        iVar3 = l;
        iVar5 = u;
        iVar6 = iVar7;
        l = iVar7 + 2;
      }
      u = iVar5;
      auxsort(L,iVar3,iVar6);
      bVar2 = true;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void auxsort(lua_State*L,int l,int u){
while(l<u){
int i,j;
lua_rawgeti(L,1,l);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,l,u);
else
lua_pop(L,2);
if(u-l==1)break;
i=(l+u)/2;
lua_rawgeti(L,1,i);
lua_rawgeti(L,1,l);
if(sort_comp(L,-2,-1))
set2(L,i,l);
else{
lua_pop(L,1);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,i,u);
else
lua_pop(L,2);
}
if(u-l==2)break;
lua_rawgeti(L,1,i);
lua_pushvalue(L,-1);
lua_rawgeti(L,1,u-1);
set2(L,i,u-1);
i=l;j=u-1;
for(;;){
while(lua_rawgeti(L,1,++i),sort_comp(L,-1,-2)){
if(i>u)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
while(lua_rawgeti(L,1,--j),sort_comp(L,-3,-1)){
if(j<l)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
if(j<i){
lua_pop(L,3);
break;
}
set2(L,i,j);
}
lua_rawgeti(L,1,u-1);
lua_rawgeti(L,1,i);
set2(L,u-1,i);
if(i-l<u-i){
j=l;i=i-1;l=i+2;
}
else{
j=i+1;i=u;u=j-2;
}
auxsort(L,j,i);
}
}